

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_true>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  size_t sVar6;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar7;
  undefined1 auVar8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  RTCIntersectFunctionN p_Var11;
  long lVar12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar13;
  size_t sVar14;
  uint uVar15;
  size_t sVar16;
  NodeRef *pNVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar28;
  float fVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar30;
  undefined1 auVar27 [16];
  vint4 ai_2;
  undefined1 auVar31 [16];
  vint4 ai_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 ai_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 bi_1;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 ai;
  undefined1 auVar48 [16];
  vint4 bi_2;
  undefined1 in_ZMM12 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 local_1818 [16];
  RTCIntersectFunctionNArguments local_17d0;
  Geometry *local_17a0;
  undefined8 local_1798;
  RTCIntersectArguments *local_1790;
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar27 = vpcmpeqd_avx(in_ZMM12._0_16_,in_ZMM12._0_16_);
    auVar18 = vpcmpeqd_avx(auVar27,(undefined1  [16])valid_i->field_0);
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    auVar19 = auVar18 & auVar8;
    if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar19[0xf] < '\0')
    {
      local_1788 = vandps_avx(auVar8,auVar18);
      local_1758 = *(undefined1 (*) [16])ray;
      auVar49 = ZEXT1664(local_1758);
      local_1768 = *(undefined1 (*) [16])(ray + 0x10);
      auVar50 = ZEXT1664(local_1768);
      local_1778 = *(undefined1 (*) [16])(ray + 0x20);
      auVar51 = ZEXT1664(local_1778);
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar8 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar25);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      auVar8 = vcmpps_avx(auVar8,auVar32,1);
      auVar18 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar32,auVar8);
      auVar8 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar25);
      auVar8 = vcmpps_avx(auVar8,auVar32,1);
      auVar19 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar32,auVar8);
      auVar8 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar25);
      auVar8 = vcmpps_avx(auVar8,auVar32,1);
      auVar8 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar32,auVar8);
      auVar25 = vrcpps_avx(auVar18);
      local_1718 = auVar25._0_4_;
      auVar20._0_4_ = auVar18._0_4_ * local_1718;
      fStack_1714 = auVar25._4_4_;
      auVar20._4_4_ = auVar18._4_4_ * fStack_1714;
      fStack_1710 = auVar25._8_4_;
      auVar20._8_4_ = auVar18._8_4_ * fStack_1710;
      fStack_170c = auVar25._12_4_;
      auVar20._12_4_ = auVar18._12_4_ * fStack_170c;
      auVar40._8_4_ = 0x3f800000;
      auVar40._0_8_ = 0x3f8000003f800000;
      auVar40._12_4_ = 0x3f800000;
      auVar25 = vsubps_avx(auVar40,auVar20);
      auVar18 = vrcpps_avx(auVar19);
      local_1708 = auVar18._0_4_;
      auVar36._0_4_ = auVar19._0_4_ * local_1708;
      fStack_1704 = auVar18._4_4_;
      auVar36._4_4_ = auVar19._4_4_ * fStack_1704;
      fStack_1700 = auVar18._8_4_;
      auVar36._8_4_ = auVar19._8_4_ * fStack_1700;
      fStack_16fc = auVar18._12_4_;
      auVar36._12_4_ = auVar19._12_4_ * fStack_16fc;
      auVar19 = vsubps_avx(auVar40,auVar36);
      auVar18 = vrcpps_avx(auVar8);
      local_1728 = auVar18._0_4_;
      auVar26._0_4_ = local_1728 * auVar8._0_4_;
      fStack_1724 = auVar18._4_4_;
      auVar26._4_4_ = fStack_1724 * auVar8._4_4_;
      fStack_1720 = auVar18._8_4_;
      auVar26._8_4_ = fStack_1720 * auVar8._8_4_;
      fStack_171c = auVar18._12_4_;
      auVar26._12_4_ = fStack_171c * auVar8._12_4_;
      auVar18 = vsubps_avx(auVar40,auVar26);
      auVar8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar8,local_1788);
      local_1818._4_4_ = local_1788._4_4_ ^ auVar27._4_4_;
      local_1818._0_4_ = local_1788._0_4_ ^ auVar27._0_4_;
      local_1818._8_4_ = local_1788._8_4_ ^ auVar27._8_4_;
      local_1818._12_4_ = local_1788._12_4_ ^ auVar27._12_4_;
      local_1708 = local_1708 + local_1708 * auVar19._0_4_;
      fStack_1704 = fStack_1704 + fStack_1704 * auVar19._4_4_;
      fStack_1700 = fStack_1700 + fStack_1700 * auVar19._8_4_;
      fStack_16fc = fStack_16fc + fStack_16fc * auVar19._12_4_;
      auVar8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40);
      auVar27._8_4_ = 0xff800000;
      auVar27._0_8_ = 0xff800000ff800000;
      auVar27._12_4_ = 0xff800000;
      auVar8 = vblendvps_avx(auVar27,auVar8,local_1788);
      local_1718 = local_1718 + local_1718 * auVar25._0_4_;
      fStack_1714 = fStack_1714 + fStack_1714 * auVar25._4_4_;
      fStack_1710 = fStack_1710 + fStack_1710 * auVar25._8_4_;
      fStack_170c = fStack_170c + fStack_170c * auVar25._12_4_;
      local_1728 = local_1728 + local_1728 * auVar18._0_4_;
      fStack_1724 = fStack_1724 + fStack_1724 * auVar18._4_4_;
      fStack_1720 = fStack_1720 + fStack_1720 * auVar18._8_4_;
      fStack_171c = fStack_171c + fStack_171c * auVar18._12_4_;
      pNVar17 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar13 = &stack_near[2].field_0;
      stack_near[1].field_0 = local_16f8;
      local_1748 = mm_lookupmask_ps._0_8_;
      uStack_1740 = mm_lookupmask_ps._8_8_;
LAB_00ecf9fe:
      sVar16 = pNVar17[-1].ptr;
      if (sVar16 != 0xfffffffffffffff8) {
        pNVar17 = pNVar17 + -1;
        paVar1 = paVar13 + -1;
        paVar13 = paVar13 + -1;
        aVar21.v = (__m128)vcmpps_avx(*paVar1,auVar8,1);
        aVar9 = *paVar1;
        if (((((undefined1  [16])aVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             ((undefined1  [16])aVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            ((undefined1  [16])aVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            aVar21.i[3]._3_1_ < '\0') {
          do {
            uVar15 = (uint)sVar16;
            if ((sVar16 & 8) != 0) {
              if (sVar16 == 0xfffffffffffffff8) goto LAB_00ecfddc;
              auVar27 = vcmpps_avx(auVar8,(undefined1  [16])aVar9,6);
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar27[0xf] < '\0') {
                auVar27 = vpcmpeqd_avx(auVar27,auVar27);
                lVar12 = 0;
                local_1738 = auVar27 ^ local_1818;
                goto LAB_00ecfc72;
              }
              break;
            }
            uVar10 = sVar16 & 0xfffffffffffffff0;
            aVar21.i[2] = 0x7f800000;
            aVar21._0_8_ = 0x7f8000007f800000;
            aVar21.i[3] = 0x7f800000;
            sVar16 = 8;
            for (lVar12 = -0x10;
                (lVar12 != 0 && (sVar6 = *(size_t *)(uVar10 + 0x20 + lVar12 * 2), sVar6 != 8));
                lVar12 = lVar12 + 4) {
              fVar2 = *(float *)(uVar10 + 0x90 + lVar12);
              fVar3 = *(float *)(uVar10 + 0x30 + lVar12);
              auVar27 = *(undefined1 (*) [16])(ray + 0x70);
              fVar24 = auVar27._0_4_;
              fVar28 = auVar27._4_4_;
              fVar29 = auVar27._8_4_;
              fVar30 = auVar27._12_4_;
              auVar31._0_4_ = fVar24 * fVar2 + fVar3;
              auVar31._4_4_ = fVar28 * fVar2 + fVar3;
              auVar31._8_4_ = fVar29 * fVar2 + fVar3;
              auVar31._12_4_ = fVar30 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar10 + 0xb0 + lVar12);
              fVar3 = *(float *)(uVar10 + 0x50 + lVar12);
              auVar33._0_4_ = fVar24 * fVar2 + fVar3;
              auVar33._4_4_ = fVar28 * fVar2 + fVar3;
              auVar33._8_4_ = fVar29 * fVar2 + fVar3;
              auVar33._12_4_ = fVar30 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar10 + 0xd0 + lVar12);
              fVar3 = *(float *)(uVar10 + 0x70 + lVar12);
              auVar37._0_4_ = fVar24 * fVar2 + fVar3;
              auVar37._4_4_ = fVar28 * fVar2 + fVar3;
              auVar37._8_4_ = fVar29 * fVar2 + fVar3;
              auVar37._12_4_ = fVar30 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar10 + 0xa0 + lVar12);
              fVar3 = *(float *)(uVar10 + 0x40 + lVar12);
              auVar41._0_4_ = fVar24 * fVar2 + fVar3;
              auVar41._4_4_ = fVar28 * fVar2 + fVar3;
              auVar41._8_4_ = fVar29 * fVar2 + fVar3;
              auVar41._12_4_ = fVar30 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar10 + 0xc0 + lVar12);
              fVar3 = *(float *)(uVar10 + 0x60 + lVar12);
              auVar44._0_4_ = fVar3 + fVar24 * fVar2;
              auVar44._4_4_ = fVar3 + fVar28 * fVar2;
              auVar44._8_4_ = fVar3 + fVar29 * fVar2;
              auVar44._12_4_ = fVar3 + fVar30 * fVar2;
              fVar2 = *(float *)(uVar10 + 0xe0 + lVar12);
              fVar3 = *(float *)(uVar10 + 0x80 + lVar12);
              auVar46._0_4_ = fVar2 * fVar24 + fVar3;
              auVar46._4_4_ = fVar2 * fVar28 + fVar3;
              auVar46._8_4_ = fVar2 * fVar29 + fVar3;
              auVar46._12_4_ = fVar2 * fVar30 + fVar3;
              auVar18 = vsubps_avx(auVar31,auVar49._0_16_);
              auVar48._0_4_ = local_1718 * auVar18._0_4_;
              auVar48._4_4_ = fStack_1714 * auVar18._4_4_;
              auVar48._8_4_ = fStack_1710 * auVar18._8_4_;
              auVar48._12_4_ = fStack_170c * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar33,auVar50._0_16_);
              auVar34._0_4_ = local_1708 * auVar18._0_4_;
              auVar34._4_4_ = fStack_1704 * auVar18._4_4_;
              auVar34._8_4_ = fStack_1700 * auVar18._8_4_;
              auVar34._12_4_ = fStack_16fc * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar37,auVar51._0_16_);
              auVar38._0_4_ = local_1728 * auVar18._0_4_;
              auVar38._4_4_ = fStack_1724 * auVar18._4_4_;
              auVar38._8_4_ = fStack_1720 * auVar18._8_4_;
              auVar38._12_4_ = fStack_171c * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar41,auVar49._0_16_);
              auVar42._0_4_ = local_1718 * auVar18._0_4_;
              auVar42._4_4_ = fStack_1714 * auVar18._4_4_;
              auVar42._8_4_ = fStack_1710 * auVar18._8_4_;
              auVar42._12_4_ = fStack_170c * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar44,auVar50._0_16_);
              auVar45._0_4_ = local_1708 * auVar18._0_4_;
              auVar45._4_4_ = fStack_1704 * auVar18._4_4_;
              auVar45._8_4_ = fStack_1700 * auVar18._8_4_;
              auVar45._12_4_ = fStack_16fc * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar46,auVar51._0_16_);
              auVar47._0_4_ = local_1728 * auVar18._0_4_;
              auVar47._4_4_ = fStack_1724 * auVar18._4_4_;
              auVar47._8_4_ = fStack_1720 * auVar18._8_4_;
              auVar47._12_4_ = fStack_171c * auVar18._12_4_;
              auVar18 = vpminsd_avx(auVar48,auVar42);
              auVar19 = vpminsd_avx(auVar34,auVar45);
              auVar18 = vpmaxsd_avx(auVar18,auVar19);
              auVar19 = vpminsd_avx(auVar38,auVar47);
              auVar18 = vpmaxsd_avx(auVar18,auVar19);
              auVar19 = vpmaxsd_avx(auVar48,auVar42);
              auVar25 = vpmaxsd_avx(auVar34,auVar45);
              auVar25 = vpminsd_avx(auVar19,auVar25);
              auVar19 = vpmaxsd_avx(auVar38,auVar47);
              auVar19 = vpminsd_avx(auVar19,auVar8);
              auVar25 = vpminsd_avx(auVar25,auVar19);
              auVar19 = vpmaxsd_avx(auVar18,(undefined1  [16])local_16f8);
              if ((uVar15 & 7) == 6) {
                auVar19 = vcmpps_avx(auVar19,auVar25,2);
                uVar4 = *(undefined4 *)(uVar10 + 0xf0 + lVar12);
                auVar39._4_4_ = uVar4;
                auVar39._0_4_ = uVar4;
                auVar39._8_4_ = uVar4;
                auVar39._12_4_ = uVar4;
                auVar25 = vcmpps_avx(auVar39,auVar27,2);
                uVar4 = *(undefined4 *)(uVar10 + 0x100 + lVar12);
                auVar43._4_4_ = uVar4;
                auVar43._0_4_ = uVar4;
                auVar43._8_4_ = uVar4;
                auVar43._12_4_ = uVar4;
                auVar27 = vcmpps_avx(auVar27,auVar43,1);
                auVar27 = vandps_avx(auVar25,auVar27);
                auVar27 = vandps_avx(auVar27,auVar19);
              }
              else {
                auVar27 = vcmpps_avx(auVar19,auVar25,2);
              }
              auVar19 = vcmpps_avx(auVar8,(undefined1  [16])aVar9,6);
              auVar27 = vandps_avx(auVar27,auVar19);
              auVar27 = vpslld_avx(auVar27,0x1f);
              sVar14 = sVar16;
              aVar7 = aVar21;
              if (((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar27[0xf] < '\0') &&
                 (auVar35._8_4_ = 0x7f800000, auVar35._0_8_ = 0x7f8000007f800000,
                 auVar35._12_4_ = 0x7f800000,
                 aVar7 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar35,auVar18,auVar27), sVar14 = sVar6, sVar16 != 8)) {
                pNVar17->ptr = sVar16;
                pNVar17 = pNVar17 + 1;
                *paVar13 = aVar21;
                paVar13 = paVar13 + 1;
              }
              aVar21 = aVar7;
              sVar16 = sVar14;
            }
            aVar9 = aVar21;
          } while (sVar16 != 8);
        }
        goto LAB_00ecf9fe;
      }
LAB_00ecfddc:
      auVar8 = vandps_avx(local_1818,local_1788);
      auVar23._8_4_ = 0xff800000;
      auVar23._0_8_ = 0xff800000ff800000;
      auVar23._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar23);
      *(undefined1 (*) [16])(ray + 0x80) = auVar8;
    }
  }
  return;
  while( true ) {
    local_17d0.geomID = *(uint *)((sVar16 & 0xfffffffffffffff0) + lVar12 * 8);
    local_17a0 = (context->scene->geometries).items[local_17d0.geomID].ptr;
    uVar5 = local_17a0->mask;
    auVar18._4_4_ = uVar5;
    auVar18._0_4_ = uVar5;
    auVar18._8_4_ = uVar5;
    auVar18._12_4_ = uVar5;
    auVar27 = vandps_avx(auVar18,*(undefined1 (*) [16])(ray + 0x90));
    auVar27 = vpcmpeqd_avx(auVar27,_DAT_01f45a50);
    auVar18 = local_1738 & ~auVar27;
    aVar21._8_8_ = uStack_1740;
    aVar21._0_8_ = local_1748;
    if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar18[0xf] < '\0')
    {
      mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vandnps_avx(auVar27,local_1738);
      local_17d0.primID = *(uint *)((sVar16 & 0xfffffffffffffff0) + 4 + lVar12 * 8);
      local_17d0.valid = (int *)&mask;
      local_17d0.geometryUserPtr = local_17a0->userPtr;
      local_17d0.context = context->user;
      local_17d0.N = 4;
      local_1798 = 0;
      local_1790 = context->args;
      p_Var11 = local_1790->intersect;
      if (p_Var11 == (RTCIntersectFunctionN)0x0) {
        p_Var11 = (RTCIntersectFunctionN)
                  local_17a0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      local_17d0.rayhit = (RTCRayHitN *)ray;
      (*p_Var11)(&local_17d0);
      aVar21 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,1);
      auVar49 = ZEXT1664(local_1758);
      auVar50 = ZEXT1664(local_1768);
      auVar51 = ZEXT1664(local_1778);
    }
    auVar27 = vandnps_avx((undefined1  [16])aVar21,local_1738);
    lVar12 = lVar12 + 1;
    auVar18 = local_1738 & ~(undefined1  [16])aVar21;
    local_1738 = auVar27;
    if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar18 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar18 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar18[0xf])
    break;
LAB_00ecfc72:
    auVar27 = local_1738;
    if ((ulong)(uVar15 & 0xf) - 8 == lVar12) break;
  }
  auVar18 = vpcmpeqd_avx((undefined1  [16])aVar21,(undefined1  [16])aVar21);
  auVar19._0_4_ = auVar27._0_4_ ^ auVar18._0_4_;
  auVar19._4_4_ = auVar27._4_4_ ^ auVar18._4_4_;
  auVar19._8_4_ = auVar27._8_4_ ^ auVar18._8_4_;
  auVar19._12_4_ = auVar27._12_4_ ^ auVar18._12_4_;
  local_1818 = vorps_avx(local_1818,auVar19);
  auVar27 = vpcmpeqd_avx(auVar19,auVar19);
  auVar27 = auVar27 & ~local_1818;
  if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar27[0xf])
  goto LAB_00ecfddc;
  auVar22._8_4_ = 0xff800000;
  auVar22._0_8_ = 0xff800000ff800000;
  auVar22._12_4_ = 0xff800000;
  auVar8 = vblendvps_avx(auVar8,auVar22,local_1818);
  goto LAB_00ecf9fe;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }